

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codecfactory.cpp
# Opt level: O0

unique_ptr<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>_>
FastPForLib::simdbinarypacking_codec(void)

{
  _Head_base<0UL,_FastPForLib::IntegerCODEC_*,_false> in_RDI;
  _Head_base<0UL,_FastPForLib::IntegerCODEC_*,_false> __u;
  unique_ptr<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>_>
  *in_stack_fffffffffffffff0;
  
  __u._M_head_impl = in_RDI._M_head_impl;
  make_unique<FastPForLib::CompositeCodec<FastPForLib::SIMDBinaryPacking,FastPForLib::VariableByte>>
            ();
  std::unique_ptr<FastPForLib::IntegerCODEC,std::default_delete<FastPForLib::IntegerCODEC>>::
  unique_ptr<FastPForLib::CompositeCodec<FastPForLib::SIMDBinaryPacking,FastPForLib::VariableByte>,std::default_delete<FastPForLib::CompositeCodec<FastPForLib::SIMDBinaryPacking,FastPForLib::VariableByte>>,void>
            (in_stack_fffffffffffffff0,
             (unique_ptr<FastPForLib::CompositeCodec<FastPForLib::SIMDBinaryPacking,_FastPForLib::VariableByte>,_std::default_delete<FastPForLib::CompositeCodec<FastPForLib::SIMDBinaryPacking,_FastPForLib::VariableByte>_>_>
              *)__u._M_head_impl);
  std::
  unique_ptr<FastPForLib::CompositeCodec<FastPForLib::SIMDBinaryPacking,_FastPForLib::VariableByte>,_std::default_delete<FastPForLib::CompositeCodec<FastPForLib::SIMDBinaryPacking,_FastPForLib::VariableByte>_>_>
  ::~unique_ptr((unique_ptr<FastPForLib::CompositeCodec<FastPForLib::SIMDBinaryPacking,_FastPForLib::VariableByte>,_std::default_delete<FastPForLib::CompositeCodec<FastPForLib::SIMDBinaryPacking,_FastPForLib::VariableByte>_>_>
                 *)in_RDI._M_head_impl);
  return (__uniq_ptr_data<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>,_true,_true>
          )(tuple<FastPForLib::IntegerCODEC_*,_std::default_delete<FastPForLib::IntegerCODEC>_>)
           __u._M_head_impl;
}

Assistant:

std::unique_ptr<IntegerCODEC> simdbinarypacking_codec() {
  return make_unique<CompositeCodec<SIMDBinaryPacking, VariableByte>>();
}